

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateRoot(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlNs *pxVar1;
  char cVar2;
  int iVar3;
  xmlNodePtr node;
  xmlChar *pxVar4;
  xmlChar fn [50];
  
  if (doc == (xmlDocPtr)0x0) {
    return 0;
  }
  node = xmlDocGetRootElement(doc);
  if ((node != (xmlNodePtr)0x0) && (node->name != (xmlChar *)0x0)) {
    if (((doc->intSubset != (_xmlDtd *)0x0) &&
        (pxVar4 = doc->intSubset->name, pxVar4 != (xmlChar *)0x0)) &&
       (iVar3 = xmlStrEqual(pxVar4,node->name), iVar3 == 0)) {
      pxVar1 = node->ns;
      if ((pxVar1 != (xmlNs *)0x0) && (pxVar1->prefix != (xmlChar *)0x0)) {
        pxVar4 = xmlBuildQName(node->name,pxVar1->prefix,fn,0x32);
        if (pxVar4 == (xmlChar *)0x0) {
          xmlVErrMemory(ctxt);
          cVar2 = '\x01';
        }
        else {
          iVar3 = xmlStrEqual(doc->intSubset->name,pxVar4);
          if ((pxVar4 != fn) && (pxVar4 != node->name)) {
            (*xmlFree)(pxVar4);
          }
          cVar2 = (iVar3 == 1) * '\x02';
        }
        if (cVar2 == '\x02') {
          return 1;
        }
        if (cVar2 != '\0') {
          return 0;
        }
      }
      iVar3 = xmlStrEqual(doc->intSubset->name,(xmlChar *)"HTML");
      if ((iVar3 == 0) || (iVar3 = xmlStrEqual(node->name,"html"), iVar3 == 0)) {
        pxVar4 = doc->intSubset->name;
        xmlDoErrValid(ctxt,node,XML_DTD_ROOT_NAME,2,node->name,pxVar4,(xmlChar *)0x0,0,
                      "root and DTD name do not match \'%s\' and \'%s\'\n",node->name,pxVar4,0);
        return 0;
      }
    }
    return 1;
  }
  xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_DTD_NO_ROOT,2,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                0,"no root element\n",0);
  return 0;
}

Assistant:

int
xmlValidateRoot(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlNodePtr root;
    int ret;

    if (doc == NULL) return(0);

    root = xmlDocGetRootElement(doc);
    if ((root == NULL) || (root->name == NULL)) {
	xmlErrValid(ctxt, XML_DTD_NO_ROOT,
	            "no root element\n", NULL);
        return(0);
    }

    /*
     * When doing post validation against a separate DTD, those may
     * no internal subset has been generated
     */
    if ((doc->intSubset != NULL) &&
	(doc->intSubset->name != NULL)) {
	/*
	 * Check first the document root against the NQName
	 */
	if (!xmlStrEqual(doc->intSubset->name, root->name)) {
	    if ((root->ns != NULL) && (root->ns->prefix != NULL)) {
		xmlChar fn[50];
		xmlChar *fullname;

		fullname = xmlBuildQName(root->name, root->ns->prefix, fn, 50);
		if (fullname == NULL) {
		    xmlVErrMemory(ctxt);
		    return(0);
		}
		ret = xmlStrEqual(doc->intSubset->name, fullname);
		if ((fullname != fn) && (fullname != root->name))
		    xmlFree(fullname);
		if (ret == 1)
		    goto name_ok;
	    }
	    if ((xmlStrEqual(doc->intSubset->name, BAD_CAST "HTML")) &&
		(xmlStrEqual(root->name, BAD_CAST "html")))
		goto name_ok;
	    xmlErrValidNode(ctxt, root, XML_DTD_ROOT_NAME,
		   "root and DTD name do not match '%s' and '%s'\n",
		   root->name, doc->intSubset->name, NULL);
	    return(0);
	}
    }
name_ok:
    return(1);
}